

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::MethodDescriptorProto
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  InternalMetadataWithArena *this_00;
  void *pvVar1;
  MethodOptions *from_00;
  bool bVar2;
  uint uVar3;
  MethodOptions *this_01;
  Arena *pAVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MethodDescriptorProto_00672b10;
  this_00 = &this->_internal_metadata_;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    pAVar4 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar4,(from->name_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->input_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 2) != 0) {
    pAVar4 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->input_type_,pAVar4,(from->input_type_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->output_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 4) != 0) {
    pAVar4 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->output_type_,pAVar4,(from->output_type_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 8) == 0) {
    this_01 = (MethodOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_01 = (MethodOptions *)operator_new(0x50);
    MethodOptions::MethodOptions(this_01,from_00);
  }
  this->options_ = this_01;
  bVar2 = from->server_streaming_;
  this->client_streaming_ = from->client_streaming_;
  this->server_streaming_ = bVar2;
  return;
}

Assistant:

MethodDescriptorProto::MethodDescriptorProto(const MethodDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  input_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_input_type()) {
    input_type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_input_type(),
      GetArenaNoVirtual());
  }
  output_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_output_type()) {
    output_type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_output_type(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::MethodOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&client_streaming_, &from.client_streaming_,
    static_cast<size_t>(reinterpret_cast<char*>(&server_streaming_) -
    reinterpret_cast<char*>(&client_streaming_)) + sizeof(server_streaming_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.MethodDescriptorProto)
}